

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestlstm_var1.h
# Opt level: O1

void __thiscall cnn::ForestLSTMBuilder_var1::~ForestLSTMBuilder_var1(ForestLSTMBuilder_var1 *this)

{
  pointer pEVar1;
  pointer ppPVar2;
  
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__ForestLSTMBuilder_var1_002e5558;
  pEVar1 = (this->c0).
           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pEVar1 != (pointer)0x0) {
    operator_delete(pEVar1);
  }
  pEVar1 = (this->h0).
           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pEVar1 != (pointer)0x0) {
    operator_delete(pEVar1);
  }
  pEVar1 = (this->i_w).
           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pEVar1 != (pointer)0x0) {
    operator_delete(pEVar1);
  }
  ppPVar2 = (this->wparams).
            super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppPVar2 != (pointer)0x0) {
    operator_delete(ppPVar2);
  }
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&this->c);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&this->h);
  std::
  vector<std::vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>,_std::allocator<std::vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>_>_>
  ::~vector(&this->fparam_vars);
  std::
  vector<std::vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>,_std::allocator<std::vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>_>_>
  ::~vector(&this->iocparam_vars);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&this->param_vars);
  std::
  vector<std::vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>,_std::allocator<std::vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>_>_>
  ::~vector(&this->fparams);
  std::
  vector<std::vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>,_std::allocator<std::vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>_>_>
  ::~vector(&this->iocparams);
  std::
  vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  ::~vector(&this->params);
  RNNBuilder::~RNNBuilder(&this->super_RNNBuilder);
  return;
}

Assistant:

ForestLSTMBuilder_var1() = default;